

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

Aig_Man_t * Dch_DeriveChoiceAigInt(Aig_Man_t *pAig,int fSkipRedSupps)

{
  Aig_Man_t *p;
  Aig_Obj_t **ppAVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  size_t __nmemb;
  
  p = Aig_ManStart(pAig->vObjs->nSize);
  __nmemb = (size_t)pAig->vObjs->nSize;
  ppAVar1 = (Aig_Obj_t **)calloc(__nmemb,8);
  p->pEquivs = ppAVar1;
  ppAVar1 = (Aig_Obj_t **)calloc(__nmemb,8);
  p->pReprs = ppAVar1;
  Aig_ManCleanData(pAig);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar4 = 0; iVar4 < pAig->vCis->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar4);
    pAVar3 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  if (pAig->pReprs != (Aig_Obj_t **)0x0) {
    for (iVar4 = 0; iVar4 < pAig->vObjs->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar4);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        Dch_DeriveChoiceAigNode(p,pAig,pAVar3,fSkipRedSupps);
      }
    }
    for (iVar4 = 0; iVar4 < pAig->vCos->nSize; iVar4 = iVar4 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar4);
      pAVar3 = Aig_ObjChild0CopyRepr(p,pAVar3);
      Aig_ObjCreateCo(p,pAVar3);
    }
    Aig_ManSetRegNum(p,pAig->nRegs);
    return p;
  }
  __assert_fail("pAig->pReprs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                ,0x204,"Aig_Man_t *Dch_DeriveChoiceAigInt(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Dch_DeriveChoiceAigInt( Aig_Man_t * pAig, int fSkipRedSupps )
{
    Aig_Man_t * pChoices;
    Aig_Obj_t * pObj;
    int i;
    // start recording equivalences
    pChoices = Aig_ManStart( Aig_ManObjNumMax(pAig) );
    pChoices->pEquivs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    pChoices->pReprs  = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    // map constants and PIs
    Aig_ManCleanData( pAig );
    Aig_ManConst1(pAig)->pData = Aig_ManConst1(pChoices);
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pChoices );
    // construct choices for the internal nodes
    assert( pAig->pReprs != NULL );
    Aig_ManForEachNode( pAig, pObj, i ) 
        Dch_DeriveChoiceAigNode( pChoices, pAig, pObj, fSkipRedSupps );
    Aig_ManForEachCo( pAig, pObj, i )
        Aig_ObjCreateCo( pChoices, Aig_ObjChild0CopyRepr(pChoices, pObj) );
    Aig_ManSetRegNum( pChoices, Aig_ManRegNum(pAig) );
    return pChoices;
}